

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifMap.c
# Opt level: O2

void If_ObjPerformMappingAnd(If_Man_t *p,If_Obj_t *pObj,int Mode,int fPreprocess,int fFirst)

{
  float *pfVar1;
  float fVar2;
  byte bVar3;
  short sVar4;
  If_Obj_t *pIVar5;
  If_Set_t *pIVar6;
  If_Cut_t *pC0;
  If_Cut_t *pC1;
  If_Cut_t *pC;
  If_DsdMan_t *pIVar7;
  Vec_Str_t *pVVar8;
  _func_int_If_Man_t_ptr_uint_ptr_int_int_char_ptr *p_Var9;
  _func_int_If_Man_t_ptr_If_Cut_t_ptr *p_Var10;
  If_Cut_t *pIVar11;
  bool bVar12;
  bool bVar13;
  char cVar14;
  int iVar15;
  uint uVar16;
  uint uVar17;
  int iVar18;
  int iVar19;
  If_Man_t *pIVar20;
  abctime aVar21;
  word *pwVar22;
  uint *puVar23;
  If_Par_t *pIVar24;
  uint uVar25;
  uint uVar26;
  ulong uVar27;
  If_Cut_t *pIVar28;
  long lVar29;
  int iVar30;
  word t;
  uint uVar31;
  int iVar32;
  If_Cut_t *pIVar33;
  If_Cut_t *pIVar34;
  If_Man_t *pIVar35;
  char *__assertion;
  long lVar36;
  float fVar37;
  uint local_874;
  long local_860;
  word Cof0 [128];
  word local_438 [129];
  
  pIVar24 = p->pPars;
  local_874 = 1;
  uVar25 = 1;
  if ((((((pIVar24->fDelayOpt == 0) && (pIVar24->fDelayOptLut == 0)) &&
        (uVar25 = local_874, pIVar24->fDsdBalance == 0)) &&
       ((pIVar24->fUserRecLib == 0 && (pIVar24->fUseDsdTune == 0)))) && (pIVar24->fUseCofVars == 0))
     && ((pIVar24->fUseAndVars == 0 && (pIVar24->fUse34Spec == 0)))) {
    uVar25 = (uint)(pIVar24->pLutStruct != (char *)0x0);
  }
  local_874 = uVar25;
  bVar12 = true;
  if (pIVar24->nAndDelay < 1) {
    bVar12 = 0 < pIVar24->nAndArea;
  }
  if ((((undefined1  [112])*pObj->pFanin0 & (undefined1  [112])0xf) == (undefined1  [112])0x4) &&
     (pObj->pFanin0->pCutSet->nCuts < 1)) {
    __assertion = "!If_ObjIsAnd(pObj->pFanin0) || pObj->pFanin0->pCutSet->nCuts > 0";
    uVar25 = 0x68;
LAB_0033b59f:
    __assert_fail(__assertion,
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifMap.c"
                  ,uVar25,"void If_ObjPerformMappingAnd(If_Man_t *, If_Obj_t *, int, int, int)");
  }
  if ((((undefined1  [112])*pObj->pFanin1 & (undefined1  [112])0xf) == (undefined1  [112])0x4) &&
     (pObj->pFanin1->pCutSet->nCuts < 1)) {
    __assertion = "!If_ObjIsAnd(pObj->pFanin1) || pObj->pFanin1->pCutSet->nCuts > 0";
    uVar25 = 0x69;
    goto LAB_0033b59f;
  }
  if (Mode == 0) {
    pObj->EstRefs = (float)pObj->nRefs;
    bVar13 = true;
  }
  else {
    if (Mode == 1) {
      iVar15 = pObj->nRefs;
      pObj->EstRefs = (pObj->EstRefs + pObj->EstRefs + (float)iVar15) / 3.0;
    }
    else {
      iVar15 = pObj->nRefs;
    }
    if (0 < iVar15) {
      If_CutAreaDeref(p,&pObj->CutBest);
    }
    bVar13 = false;
  }
  pIVar20 = (If_Man_t *)If_ManSetupNodeCutSet(p,pObj);
  pIVar11 = &pObj->CutBest;
  if (fFirst != 0) goto LAB_0033a4cb;
  pIVar24 = p->pPars;
  if (pIVar24->fDelayOpt == 0) {
    if (pIVar24->fDsdBalance != 0) {
      pIVar35 = p;
      iVar15 = If_CutDsdBalanceEval(p,pIVar11,(Vec_Int_t *)0x0);
      iVar18 = (int)pIVar35;
      goto LAB_0033a3b0;
    }
    if (pIVar24->fUserRecLib != 0) {
      pIVar35 = p;
      iVar15 = If_CutDelayRecCost3(p,pIVar11,pObj);
      iVar18 = (int)pIVar35;
      goto LAB_0033a3b0;
    }
    if (pIVar24->fDelayOptLut != 0) {
      pIVar35 = p;
      iVar15 = If_CutLutBalanceEval(p,pIVar11);
      iVar18 = (int)pIVar35;
      goto LAB_0033a3b0;
    }
    if (0 < pIVar24->nGateSize) {
      pIVar35 = p;
      iVar15 = If_CutDelaySop(p,pIVar11);
      iVar18 = (int)pIVar35;
      goto LAB_0033a3b0;
    }
    pIVar35 = p;
    fVar37 = If_CutDelay(p,pObj,pIVar11);
    iVar18 = (int)pIVar35;
  }
  else {
    pIVar35 = p;
    iVar15 = If_CutSopBalanceEval(p,pIVar11,(Vec_Int_t *)0x0);
    iVar18 = (int)pIVar35;
LAB_0033a3b0:
    fVar37 = (float)iVar15;
  }
  (pObj->CutBest).Delay = fVar37;
  if ((fVar37 == -1.0) && (!NAN(fVar37))) {
    __assert_fail("pCut->Delay != -1",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifMap.c"
                  ,0x88,"void If_ObjPerformMappingAnd(If_Man_t *, If_Obj_t *, int, int, int)");
  }
  fVar2 = p->fEpsilon;
  if (fVar2 + fVar2 + pObj->Required < fVar37) {
    Abc_Print(iVar18,
              "If_ObjPerformMappingAnd(): Warning! Delay of node %d (%f) exceeds the required times (%f).\n"
              ,(double)fVar37,(double)(pObj->Required + fVar2),(ulong)(uint)pObj->Id);
  }
  if (Mode == 2) {
    fVar37 = If_CutAreaDerefed(p,pIVar11);
  }
  else {
    fVar37 = If_CutAreaFlow(p,pIVar11);
  }
  pIVar11->Area = fVar37;
  pIVar24 = p->pPars;
  if (pIVar24->fEdge != 0) {
    if (Mode == 2) {
      fVar37 = If_CutEdgeDerefed(p,pIVar11);
    }
    else {
      fVar37 = If_CutEdgeFlow(p,pIVar11);
    }
    (pObj->CutBest).Edge = fVar37;
    pIVar24 = p->pPars;
  }
  if (pIVar24->fPower != 0) {
    if (Mode == 2) {
      fVar37 = If_CutPowerDerefed(p,pIVar11,pObj);
    }
    else {
      fVar37 = If_CutPowerFlow(p,pIVar11,pObj);
    }
    (pObj->CutBest).Power = fVar37;
  }
  if (fPreprocess == 0) {
    pIVar5 = pIVar20->pConst1;
    sVar4 = *(short *)((long)&pIVar20->pName + 2);
    *(short *)((long)&pIVar20->pName + 2) = sVar4 + 1;
    memcpy(*(If_Cut_t **)((long)&pIVar5->field_0x0 + (long)sVar4 * 8),pIVar11,(long)p->nCutBytes);
  }
LAB_0033a4cb:
  lVar29 = 0;
  do {
    pIVar6 = pObj->pFanin0->pCutSet;
    if ((pIVar6->nCuts <= lVar29) || (pC0 = pIVar6->ppCuts[lVar29], pC0 == (If_Cut_t *)0x0)) {
      if (*(short *)((long)&pIVar20->pName + 2) < 1) {
        __assert_fail("pCutSet->nCuts > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifMap.c"
                      ,0x176,"void If_ObjPerformMappingAnd(If_Man_t *, If_Obj_t *, int, int, int)");
      }
      if ((((fPreprocess == 0) ||
           ((*(If_Cut_t **)pIVar20->pConst1)->Delay <= pObj->Required + p->fEpsilon)) &&
          (memcpy(pIVar11,*(If_Cut_t **)pIVar20->pConst1,(long)p->nCutBytes),
          p->pPars->fUserRecLib != 0)) &&
         (((~*(uint *)&(pObj->CutBest).field_0x1c & 0xfff) == 0 ||
          (pfVar1 = &(pObj->CutBest).Delay, 1e+09 < *pfVar1 || *pfVar1 == 1e+09)))) {
        __assert_fail("If_ObjCutBest(pObj)->Cost < IF_COST_MAX && If_ObjCutBest(pObj)->Delay < ABC_INFINITY"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifMap.c"
                      ,0x17e,"void If_ObjPerformMappingAnd(If_Man_t *, If_Obj_t *, int, int, int)");
      }
      pIVar35 = pIVar20;
      if (((pObj->field_0x1 & 0x10) == 0) && (0x1ffffff < *(uint *)&(pObj->CutBest).field_0x1c)) {
        pIVar5 = pIVar20->pConst1;
        sVar4 = *(short *)((long)&pIVar20->pName + 2);
        *(short *)((long)&pIVar20->pName + 2) = sVar4 + 1;
        pIVar35 = p;
        If_ManSetupCutTriv(p,*(If_Cut_t **)((long)&pIVar5->field_0x0 + (long)sVar4 * 8),pObj->Id);
        if (*(short *)&pIVar20->pName + 1 < (int)*(short *)((long)&pIVar20->pName + 2)) {
          __assert_fail("pCutSet->nCuts <= pCutSet->nCutsMax+1",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifMap.c"
                        ,0x184,"void If_ObjPerformMappingAnd(If_Man_t *, If_Obj_t *, int, int, int)"
                       );
        }
      }
      iVar15 = (int)pIVar35;
      if ((!bVar13) && (0 < pObj->nRefs)) {
        pIVar20 = p;
        If_CutAreaRef(p,pIVar11);
        iVar15 = (int)pIVar20;
      }
      if (((pObj->CutBest).field_0x1d & 0x40) != 0) {
        Abc_Print(iVar15,"The best cut is useless.\n");
      }
      if (p->pPars->pFuncUser != (_func_int_If_Man_t_ptr_If_Obj_t_ptr_If_Cut_t_ptr *)0x0) {
        for (lVar29 = 0;
            (lVar29 < pObj->pCutSet->nCuts &&
            (pIVar11 = pObj->pCutSet->ppCuts[lVar29], pIVar11 != (If_Cut_t *)0x0));
            lVar29 = lVar29 + 1) {
          (*p->pPars->pFuncUser)(p,pObj,pIVar11);
        }
      }
      If_ManDerefNodeCutSet(p,pObj);
      return;
    }
    for (lVar36 = 0;
        (pIVar6 = pObj->pFanin1->pCutSet, lVar36 < pIVar6->nCuts &&
        (pC1 = pIVar6->ppCuts[lVar36], pC1 != (If_Cut_t *)0x0)); lVar36 = lVar36 + 1) {
      sVar4 = *(short *)((long)&pIVar20->pName + 2);
      if (*(short *)&pIVar20->pName < sVar4) {
        __assert_fail("pCutSet->nCuts <= pCutSet->nCutsMax",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifMap.c"
                      ,0x9c,"void If_ObjPerformMappingAnd(If_Man_t *, If_Obj_t *, int, int, int)");
      }
      uVar25 = pC1->uSign | pC0->uSign;
      uVar25 = (uVar25 >> 1 & 0x55555555) + (uVar25 & 0x55555555);
      uVar25 = (uVar25 >> 2 & 0x33333333) + (uVar25 & 0x33333333);
      uVar25 = (uVar25 >> 4 & 0x7070707) + (uVar25 & 0x7070707);
      uVar25 = (uVar25 >> 8 & 0xf000f) + (uVar25 & 0xf000f);
      if ((int)((uVar25 >> 0x10) + (uVar25 & 0xffff)) <= p->pPars->nLutSize) {
        pC = *(If_Cut_t **)((long)&pIVar20->pConst1->field_0x0 + (long)sVar4 * 8);
        uVar25 = *(uint *)pObj >> 4 & 1 ^ *(uint *)&pC0->field_0x1c >> 0xc & 1 ^ pC0->iCutFunc;
        uVar31 = *(uint *)pObj >> 5 & 1 ^ pC1->iCutFunc ^ *(uint *)&pC1->field_0x1c >> 0xc & 1;
        pIVar28 = pC1;
        pIVar33 = pC0;
        uVar17 = uVar31;
        if (p->pPars->fUseTtPerm == 0) {
          iVar15 = If_CutMergeOrdered(p,pC0,pC1,pC);
        }
        else {
          uVar16 = *(uint *)&pC0->field_0x1c >> 0x18;
          uVar26 = *(uint *)&pC1->field_0x1c >> 0x18;
          if ((uVar16 <= uVar26) && ((uVar16 != uVar26 || ((int)uVar25 <= (int)uVar31)))) {
            pIVar28 = pC0;
            pIVar33 = pC1;
            uVar17 = uVar25;
            uVar25 = uVar31;
          }
          iVar15 = If_CutMerge(p,pIVar33,pIVar28,pC);
        }
        if ((iVar15 != 0) &&
           (((pObj->field_0x1 & 4) == 0 || ((uint)(byte)pC->field_0x1f != p->pPars->nLutSize)))) {
          p->nCutsMerged = p->nCutsMerged + 1;
          p->nCutsTotal = p->nCutsTotal + 1;
          if ((p->pPars->fSkipCutFilter != 0) ||
             (iVar15 = If_CutFilter((If_Set_t *)pIVar20,pC,local_874), iVar15 == 0)) {
            uVar31 = 0;
            if (((bool)((*(uint *)&pC->field_0x1c & 0xff000000) == 0x2000000 & bVar12)) &&
               (pC[1].Area == (float)pObj->pFanin0->Id)) {
              uVar31 = (uint)(pC[1].Edge == (float)pObj->pFanin1->Id) << 0xf;
            }
            pC->iCutFunc = -1;
            *(uint *)&pC->field_0x1c = *(uint *)&pC->field_0x1c & 0xffff6fff | uVar31;
            pIVar24 = p->pPars;
            if (pIVar24->fTruth == 0) goto LAB_0033abac;
            if (pIVar24->fVerbose == 0) {
              local_860 = 0;
            }
            else {
              local_860 = Abc_Clock();
              pIVar24 = p->pPars;
            }
            pIVar34 = pC;
            if (pIVar24->fUseTtPerm == 0) {
              iVar15 = If_CutComputeTruth(p,pC,pC0,pC1,*(uint *)pObj >> 4 & 1,*(uint *)pObj >> 5 & 1
                                         );
            }
            else {
              iVar15 = If_CutComputeTruthPerm(p,pC,pIVar33,pIVar28,uVar25,uVar17);
            }
            pIVar24 = p->pPars;
            if (pIVar24->fVerbose != 0) {
              aVar21 = Abc_Clock();
              p->timeCache[4] = p->timeCache[4] + (aVar21 - local_860);
              pIVar24 = p->pPars;
            }
            if ((pIVar24->fSkipCutFilter == 0) && (iVar15 != 0)) {
              pIVar34 = pC;
              iVar15 = If_CutFilter((If_Set_t *)pIVar20,pC,local_874);
              if (iVar15 != 0) goto LAB_0033a591;
              pIVar24 = p->pPars;
            }
            if (pIVar24->fUseDsd == 0) {
              uVar25 = *(uint *)&pC->field_0x1c;
            }
            else {
              uVar17 = Abc_Lit2Var(pC->iCutFunc);
              uVar25 = *(uint *)&pC->field_0x1c;
              if ((int)uVar17 < p->vTtDsds[uVar25 >> 0x18]->nSize) {
                pIVar34 = (If_Cut_t *)(ulong)uVar17;
                iVar15 = Vec_IntEntry(p->vTtDsds[uVar25 >> 0x18],uVar17);
                if (iVar15 == -1) {
                  uVar25 = *(uint *)&pC->field_0x1c;
                  goto LAB_0033a859;
                }
              }
              else {
LAB_0033a859:
                while (p->vTtDsds[uVar25 >> 0x18]->nSize <= (int)uVar17) {
                  Vec_IntPush(p->vTtDsds[uVar25 >> 0x18],(int)pIVar34);
                  uVar31 = 0;
                  while( true ) {
                    uVar25 = *(uint *)&pC->field_0x1c;
                    uVar16 = uVar25 >> 0x18;
                    uVar27 = (ulong)uVar16;
                    if (uVar16 < 7) {
                      uVar16 = 6;
                    }
                    if (uVar16 <= uVar31) break;
                    pIVar34 = (If_Cut_t *)0x78;
                    Vec_StrPush(p->vTtPerms[uVar27],'x');
                    uVar31 = uVar31 + 1;
                  }
                }
                pIVar7 = p->pIfDsdMan;
                pwVar22 = If_CutTruthWR(p,pC);
                bVar3 = pC->field_0x1f;
                pVVar8 = p->vTtPerms[bVar3];
                iVar15 = Abc_Lit2Var(pC->iCutFunc);
                uVar25 = (uint)(byte)pC->field_0x1f;
                if ((byte)pC->field_0x1f < 7) {
                  uVar25 = 6;
                }
                if (pVVar8->nSize <= (int)(uVar25 * iVar15)) {
                  __assert_fail("i >= 0 && i < p->nSize",
                                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecStr.h"
                                ,0x175,"char *Vec_StrEntryP(Vec_Str_t *, int)");
                }
                iVar15 = If_DsdManCompute(pIVar7,pwVar22,(uint)bVar3,
                                          (uchar *)(pVVar8->pArray + uVar25 * iVar15),
                                          p->pPars->pLutStruct);
                Vec_IntWriteEntry(p->vTtDsds[(byte)pC->field_0x1f],uVar17,iVar15);
              }
              pIVar7 = p->pIfDsdMan;
              uVar25 = If_CutDsdLit(p,pC);
              pIVar34 = (If_Cut_t *)(ulong)uVar25;
              uVar17 = If_DsdManSuppSize(pIVar7,uVar25);
              uVar25 = *(uint *)&pC->field_0x1c;
              if (uVar17 != uVar25 >> 0x18) {
                __assert_fail("If_DsdManSuppSize(p->pIfDsdMan, If_CutDsdLit(p, pCut)) == (int)pCut->nLeaves"
                              ,
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifMap.c"
                              ,0xe5,
                              "void If_ObjPerformMappingAnd(If_Man_t *, If_Obj_t *, int, int, int)")
                ;
              }
            }
            *(uint *)&pC->field_0x1c = uVar25 & 0xffffbfff;
            pIVar24 = p->pPars;
            p_Var9 = pIVar24->pFuncCell;
            if (p_Var9 == (_func_int_If_Man_t_ptr_uint_ptr_int_int_char_ptr *)0x0) {
              if (pIVar24->fUseDsdTune == 0) {
                if (pIVar24->fUse34Spec != 0) {
                  if (0x4ffffff < uVar25) {
                    __assert_fail("pCut->nLeaves <= 4",
                                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifMap.c"
                                  ,0x118,
                                  "void If_ObjPerformMappingAnd(If_Man_t *, If_Obj_t *, int, int, int)"
                                 );
                  }
                  if ((uVar25 & 0x7000000) == 0x4000000) {
                    puVar23 = If_CutTruth(p,pC);
                    uVar25 = *puVar23;
                    uVar17 = uVar25 & 0xffff;
                    if (((((uVar17 & uVar17 - 1) != 0) && ((short)uVar25 != 0x6996)) &&
                        (((uVar25 & 0xffff) != 0x9669 &&
                         (((uVar17 ^ 0xffff) & 0xfffe - uVar17) != 0)))) &&
                       (((uVar25 = (uVar25 >> 1 & 0x5555) + (uVar25 & 0x5555),
                         uVar25 = (uVar25 >> 2 & 0x3333) + (uVar25 & 0x3333),
                         uVar25 = (uVar25 >> 4 & 0x707) + (uVar25 & 0x707),
                         iVar15 = (uVar25 >> 8) + (uVar25 & 0xff), uVar25 = uVar17 ^ 0xffff,
                         iVar15 != 9 && (uVar25 = uVar17, iVar15 != 7)) ||
                        (iVar15 = Abc_Tt4CheckTwoLevel(uVar25), iVar15 < 1)))) {
                      pC->field_0x1d = pC->field_0x1d | 0x40;
                    }
                  }
                  goto LAB_0033abac;
                }
                if (pIVar24->fUseAndVars != 0) {
                  uVar25 = Abc_Lit2Var(pC->iCutFunc);
                  if (0xd < p->pPars->nLutSize) {
                    __assert_fail("p->pPars->nLutSize <= 13",
                                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifMap.c"
                                  ,0x121,
                                  "void If_ObjPerformMappingAnd(If_Man_t *, If_Obj_t *, int, int, int)"
                                 );
                  }
                  if ((int)uVar25 < p->vTtDecs[(byte)pC->field_0x1f]->nSize) {
                    pIVar34 = (If_Cut_t *)(ulong)uVar25;
                    iVar15 = Vec_IntEntry(p->vTtDecs[(byte)pC->field_0x1f],uVar25);
                    if (iVar15 == -1) goto LAB_0033adab;
                  }
                  else {
LAB_0033adab:
                    while( true ) {
                      uVar27 = (ulong)(byte)pC->field_0x1f;
                      if ((int)uVar25 < p->vTtDecs[uVar27]->nSize) break;
                      Vec_IntPush(p->vTtDecs[uVar27],(int)pIVar34);
                    }
                    iVar15 = p->pPars->nLutSize / 2;
                    uVar31 = (uint)(byte)pC->field_0x1f;
                    uVar17 = 0;
                    if ((iVar15 < (int)uVar31) &&
                       (uVar17 = 0,
                       uVar31 == iVar15 * 2 ||
                       SBORROW4(uVar31,iVar15 * 2) != (int)(uVar31 + iVar15 * -2) < 0)) {
                      pwVar22 = If_CutTruthWR(p,pC);
                      uVar31 = *(uint *)&pC->field_0x1c;
                      iVar18 = p->pPars->nLutSize / 2;
                      iVar15 = 1 << ((char)(uVar31 >> 0x18) - 6U & 0x1f);
                      if (uVar31 < 0x7000000) {
                        iVar15 = 1;
                      }
                      Abc_TtCopy(Cof0,pwVar22,iVar15,0);
                      uVar17 = Abc_TtProcessBiDecInt(Cof0,uVar31 >> 0x18,iVar18);
                      if (uVar17 == 0) {
                        Abc_TtCopy(Cof0,pwVar22,iVar15,1);
                        uVar31 = Abc_TtProcessBiDecInt(Cof0,uVar31 >> 0x18,iVar18);
                        uVar17 = uVar31 | 0x40000000;
                        if (uVar31 == 0) {
                          uVar17 = 0;
                        }
                      }
                      uVar27 = (ulong)(byte)pC->field_0x1f;
                    }
                    Vec_IntWriteEntry(p->vTtDecs[uVar27],uVar25,uVar17);
                  }
                  iVar15 = Vec_IntEntry(p->vTtDecs[(byte)pC->field_0x1f],uVar25);
                  if (iVar15 < 0) {
                    __assert_fail("iDecMask >= 0",
                                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifMap.c"
                                  ,0x12d,
                                  "void If_ObjPerformMappingAnd(If_Man_t *, If_Obj_t *, int, int, int)"
                                 );
                  }
                  uVar25 = 0;
                  if (iVar15 == 0) {
                    uVar25 = (uint)(p->pPars->nLutSize / 2 < (int)(*(uint *)&pC->field_0x1c >> 0x18)
                                   ) << 0xe;
                  }
                  *(uint *)&pC->field_0x1c = *(uint *)&pC->field_0x1c & 0xffffbfff | uVar25;
                  p->nCutsUselessAll = p->nCutsUselessAll + (uVar25 >> 0xe);
                  p->nCutsUseless[*(uint *)&pC->field_0x1c >> 0x18] =
                       p->nCutsUseless[*(uint *)&pC->field_0x1c >> 0x18] +
                       (uint)((*(uint *)&pC->field_0x1c >> 0xe & 1) != 0);
                  p->nCutsCountAll = p->nCutsCountAll + 1;
                  p->nCutsCount[(byte)pC->field_0x1f] = p->nCutsCount[(byte)pC->field_0x1f] + 1;
                  pIVar24 = p->pPars;
                }
                if ((pIVar24->fUseCofVars == 0) ||
                   ((pIVar24->fUseAndVars != 0 && ((pC->field_0x1d & 0x40) == 0))))
                goto LAB_0033abac;
                uVar25 = Abc_Lit2Var(pC->iCutFunc);
                if ((p->vTtVars[(byte)pC->field_0x1f]->nSize <= (int)uVar25) ||
                   (cVar14 = Vec_StrEntry(p->vTtVars[(byte)pC->field_0x1f],uVar25), cVar14 == -1)) {
                  while (p->vTtVars[(byte)pC->field_0x1f]->nSize <= (int)uVar25) {
                    Vec_StrPush(p->vTtVars[(byte)pC->field_0x1f],-1);
                  }
                  pwVar22 = If_CutTruthWR(p,pC);
                  uVar17 = *(uint *)&pC->field_0x1c;
                  uVar31 = uVar17 >> 0x18;
                  iVar15 = p->pPars->nLutSize / 2;
                  iVar18 = 1 << ((char)(uVar17 >> 0x18) - 6U & 0x1f);
                  if (uVar17 < 0x7000000) {
                    iVar18 = 1;
                  }
                  if (0xdffffff < uVar17) {
                    __assert_fail("nVars <= nVarsMax",
                                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/utilTruth.h"
                                  ,0x46b,"int Abc_TtCheckCondDep(word *, int, int)");
                  }
                  uVar17 = 0;
                  if (iVar15 + 1 < (int)uVar31) {
                    uVar16 = 0;
LAB_0033b00c:
                    uVar17 = uVar31;
                    if (uVar16 != uVar31) {
                      Abc_TtCofactor0p(Cof0,pwVar22,iVar18,uVar16);
                      Abc_TtCofactor1p(local_438,pwVar22,iVar18,uVar16);
                      uVar26 = 0;
                      iVar30 = 0;
                      iVar32 = 0;
                      do {
                        uVar17 = uVar16;
                        if (uVar31 == uVar26) break;
                        if (uVar16 != uVar26) {
                          iVar19 = Abc_TtHasVar(Cof0,uVar31,uVar26);
                          iVar30 = iVar19 + iVar30;
                          iVar19 = Abc_TtHasVar(local_438,uVar31,uVar26);
                          if ((iVar15 < iVar30) || (iVar32 = iVar32 + iVar19, iVar15 < iVar32))
                          goto LAB_0033b0b0;
                        }
                        uVar26 = uVar26 + 1;
                      } while( true );
                    }
                  }
                  if (p->vTtVars[(byte)pC->field_0x1f]->nSize <= (int)uVar25) {
                    __assert_fail("i >= 0 && i < p->nSize",
                                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecStr.h"
                                  ,0x186,"void Vec_StrWriteEntry(Vec_Str_t *, int, char)");
                  }
                  p->vTtVars[(byte)pC->field_0x1f]->pArray[uVar25] = (char)uVar17;
                }
                cVar14 = Vec_StrEntry(p->vTtVars[(byte)pC->field_0x1f],uVar25);
                if (cVar14 < '\0') {
LAB_0033b512:
                  __assert_fail("iCofVar >= 0 && iCofVar <= (int)pCut->nLeaves",
                                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifMap.c"
                                ,0x13f,
                                "void If_ObjPerformMappingAnd(If_Man_t *, If_Obj_t *, int, int, int)"
                               );
                }
                uVar25 = *(uint *)&pC->field_0x1c;
                if ((int)(uVar25 >> 0x18) < (int)cVar14) goto LAB_0033b512;
                uVar17 = (uint)(0xffffff < uVar25 && uVar25 >> 0x18 == (int)cVar14);
                *(uint *)&pC->field_0x1c = uVar25 & 0xffffbfff | uVar17 << 0xe;
                p->nCutsUselessAll = p->nCutsUselessAll + uVar17;
              }
              else {
                pIVar7 = p->pIfDsdMan;
                iVar15 = If_CutDsdLit(p,pC);
                uVar25 = If_DsdManReadMark(pIVar7,iVar15);
                *(uint *)&pC->field_0x1c =
                     *(uint *)&pC->field_0x1c & 0xffffbfff | (uVar25 & 1) << 0xe;
                p->nCutsUselessAll = p->nCutsUselessAll + (uVar25 & 1);
              }
              p->nCutsUseless[*(uint *)&pC->field_0x1c >> 0x18] =
                   p->nCutsUseless[*(uint *)&pC->field_0x1c >> 0x18] +
                   (uint)((*(uint *)&pC->field_0x1c >> 0xe & 1) != 0);
              p->nCutsCountAll = p->nCutsCountAll + 1;
              p->nCutsCount[(byte)pC->field_0x1f] = p->nCutsCount[(byte)pC->field_0x1f] + 1;
            }
            else {
              if (pIVar24->fUseTtPerm != 0) {
                __assert_fail("p->pPars->fUseTtPerm == 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifMap.c"
                              ,0xec,
                              "void If_ObjPerformMappingAnd(If_Man_t *, If_Obj_t *, int, int, int)")
                ;
              }
              if (0xc < (uVar25 >> 0x10 & 0xff) - 4) {
                __assert_fail("pCut->nLimit >= 4 && pCut->nLimit <= 16",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifMap.c"
                              ,0xed,
                              "void If_ObjPerformMappingAnd(If_Man_t *, If_Obj_t *, int, int, int)")
                ;
              }
              if (pIVar24->fUseDsd == 0) {
                puVar23 = If_CutTruth(p,pC);
                uVar17 = *(uint *)&pC->field_0x1c >> 0x18;
                uVar25 = 6;
                if (6 < uVar17) {
                  uVar25 = uVar17;
                }
                iVar15 = (*p_Var9)(p,puVar23,uVar25,uVar17,p->pPars->pLutStruct);
                uVar25 = (uint)(iVar15 == 0);
              }
              else {
                pIVar7 = p->pIfDsdMan;
                iVar15 = If_CutDsdLit(p,pC);
                uVar25 = If_DsdManCheckDec(pIVar7,iVar15);
                uVar25 = uVar25 & 1;
              }
              *(uint *)&pC->field_0x1c = *(uint *)&pC->field_0x1c & 0xffffbfff | uVar25 << 0xe;
              p->nCutsUselessAll = p->nCutsUselessAll + uVar25;
              p->nCutsUseless[*(uint *)&pC->field_0x1c >> 0x18] =
                   p->nCutsUseless[*(uint *)&pC->field_0x1c >> 0x18] +
                   (uint)((*(uint *)&pC->field_0x1c >> 0xe & 1) != 0);
              p->nCutsCountAll = p->nCutsCountAll + 1;
              p->nCutsCount[(byte)pC->field_0x1f] = p->nCutsCount[(byte)pC->field_0x1f] + 1;
              pIVar24 = p->pPars;
              if (((pIVar24->fEnableCheck75 == 0) && (pIVar24->fEnableCheck75u == 0)) ||
                 (*(short *)&pC->field_0x1e != 0x505)) {
                if ((pIVar24->fVerbose != 0) && (pC->field_0x1f == '\x05')) {
                  puVar23 = If_CutTruth(p,pC);
                  t = CONCAT44(*puVar23,*puVar23);
                  p->nCuts5 = p->nCuts5 + 1;
                  iVar15 = If_CluCheckDecInAny(t,5);
                  if ((iVar15 != 0) || (iVar15 = If_CluCheckDecOut(t,5), iVar15 != 0))
                  goto LAB_0033aba5;
                }
              }
              else {
                puVar23 = If_CutTruth(p,pC);
                uVar25 = *puVar23;
                p->nCuts5 = p->nCuts5 + 1;
                iVar15 = If_CluCheckDecInAny(CONCAT44(uVar25,uVar25),5);
                if (iVar15 == 0) goto LAB_0033a591;
LAB_0033aba5:
                p->nCuts5a = p->nCuts5a + 1;
              }
            }
LAB_0033abac:
            uVar25 = *(uint *)&pC->field_0x1c & 0xffffdfff |
                     (uint)(p->pPars->pFuncCost != (_func_int_If_Man_t_ptr_If_Cut_t_ptr *)0x0) <<
                     0xd;
            *(uint *)&pC->field_0x1c = uVar25;
            p_Var10 = p->pPars->pFuncCost;
            if (p_Var10 == (_func_int_If_Man_t_ptr_If_Cut_t_ptr *)0x0) {
              uVar17 = 0;
            }
            else {
              uVar17 = (*p_Var10)(p,pC);
              uVar17 = uVar17 & 0xfff;
              uVar25 = *(uint *)&pC->field_0x1c;
            }
            *(uint *)&pC->field_0x1c = uVar25 & 0xfffff000 | uVar17;
            if (uVar17 != 0xfff) {
              pIVar24 = p->pPars;
              if (pIVar24->fDelayOpt == 0) {
                if (pIVar24->fDsdBalance != 0) {
                  iVar15 = If_CutDsdBalanceEval(p,pC,(Vec_Int_t *)0x0);
                  goto LAB_0033b0f1;
                }
                if (pIVar24->fUserRecLib != 0) {
                  iVar15 = If_CutDelayRecCost3(p,pC,pObj);
                  goto LAB_0033b0f1;
                }
                if (pIVar24->fDelayOptLut != 0) {
                  iVar15 = If_CutLutBalanceEval(p,pC);
                  goto LAB_0033b0f1;
                }
                if (0 < pIVar24->nGateSize) {
                  iVar15 = If_CutDelaySop(p,pC);
                  goto LAB_0033b0f1;
                }
                fVar37 = If_CutDelay(p,pObj,pC);
              }
              else {
                iVar15 = If_CutSopBalanceEval(p,pC,(Vec_Int_t *)0x0);
LAB_0033b0f1:
                fVar37 = (float)iVar15;
              }
              pC->Delay = fVar37;
              if (((fVar37 != -1.0) || (NAN(fVar37))) &&
                 ((bVar13 || (fVar37 <= pObj->Required + p->fEpsilon)))) {
                if (Mode == 2) {
                  fVar37 = If_CutAreaDerefed(p,pC);
                }
                else {
                  fVar37 = If_CutAreaFlow(p,pC);
                }
                pC->Area = fVar37;
                pIVar24 = p->pPars;
                if (pIVar24->fEdge != 0) {
                  if (Mode == 2) {
                    fVar37 = If_CutEdgeDerefed(p,pC);
                  }
                  else {
                    fVar37 = If_CutEdgeFlow(p,pC);
                  }
                  pC->Edge = fVar37;
                  pIVar24 = p->pPars;
                }
                if (pIVar24->fPower != 0) {
                  if (Mode == 2) {
                    fVar37 = If_CutPowerDerefed(p,pC,pObj);
                  }
                  else {
                    fVar37 = If_CutPowerFlow(p,pC,pObj);
                  }
                  pC->Power = fVar37;
                }
                If_CutSort(p,(If_Set_t *)pIVar20,pC);
              }
            }
          }
        }
      }
LAB_0033a591:
    }
    lVar29 = lVar29 + 1;
  } while( true );
LAB_0033b0b0:
  uVar16 = uVar16 + 1;
  goto LAB_0033b00c;
}

Assistant:

void If_ObjPerformMappingAnd( If_Man_t * p, If_Obj_t * pObj, int Mode, int fPreprocess, int fFirst )
{
    If_Set_t * pCutSet;
    If_Cut_t * pCut0, * pCut1, * pCut;
    If_Cut_t * pCut0R, * pCut1R;
    int fFunc0R, fFunc1R;
    int i, k, v, iCutDsd, fChange;
    int fSave0 = p->pPars->fDelayOpt || p->pPars->fDelayOptLut || p->pPars->fDsdBalance || p->pPars->fUserRecLib || p->pPars->fUseDsdTune || p->pPars->fUseCofVars || p->pPars->fUseAndVars || p->pPars->fUse34Spec || p->pPars->pLutStruct != NULL;
    int fUseAndCut = (p->pPars->nAndDelay > 0) || (p->pPars->nAndArea > 0);
    assert( !If_ObjIsAnd(pObj->pFanin0) || pObj->pFanin0->pCutSet->nCuts > 0 );
    assert( !If_ObjIsAnd(pObj->pFanin1) || pObj->pFanin1->pCutSet->nCuts > 0 );

    // prepare
    if ( Mode == 0 )
        pObj->EstRefs = (float)pObj->nRefs;
    else if ( Mode == 1 )
        pObj->EstRefs = (float)((2.0 * pObj->EstRefs + pObj->nRefs) / 3.0);
    // deref the selected cut
    if ( Mode && pObj->nRefs > 0 )
        If_CutAreaDeref( p, If_ObjCutBest(pObj) );

    // prepare the cutset
    pCutSet = If_ManSetupNodeCutSet( p, pObj );

    // get the current assigned best cut
    pCut = If_ObjCutBest(pObj);
    if ( !fFirst )
    {
        // recompute the parameters of the best cut
        if ( p->pPars->fDelayOpt )
            pCut->Delay = If_CutSopBalanceEval( p, pCut, NULL );
        else if ( p->pPars->fDsdBalance )
            pCut->Delay = If_CutDsdBalanceEval( p, pCut, NULL );
        else if ( p->pPars->fUserRecLib )
            pCut->Delay = If_CutDelayRecCost3( p, pCut, pObj ); 
        else if ( p->pPars->fDelayOptLut )
            pCut->Delay = If_CutLutBalanceEval( p, pCut );
        else if( p->pPars->nGateSize > 0 )
            pCut->Delay = If_CutDelaySop( p, pCut );
        else
            pCut->Delay = If_CutDelay( p, pObj, pCut );
        assert( pCut->Delay != -1 );
//        assert( pCut->Delay <= pObj->Required + p->fEpsilon );
        if ( pCut->Delay > pObj->Required + 2*p->fEpsilon )
            Abc_Print( 1, "If_ObjPerformMappingAnd(): Warning! Delay of node %d (%f) exceeds the required times (%f).\n", 
                pObj->Id, pCut->Delay, pObj->Required + p->fEpsilon );
        pCut->Area = (Mode == 2)? If_CutAreaDerefed( p, pCut ) : If_CutAreaFlow( p, pCut );
        if ( p->pPars->fEdge )
            pCut->Edge = (Mode == 2)? If_CutEdgeDerefed( p, pCut ) : If_CutEdgeFlow( p, pCut );
        if ( p->pPars->fPower )
            pCut->Power = (Mode == 2)? If_CutPowerDerefed( p, pCut, pObj ) : If_CutPowerFlow( p, pCut, pObj );
        // save the best cut from the previous iteration
        if ( !fPreprocess )
            If_CutCopy( p, pCutSet->ppCuts[pCutSet->nCuts++], pCut );
    }

    // generate cuts
    If_ObjForEachCut( pObj->pFanin0, pCut0, i )
    If_ObjForEachCut( pObj->pFanin1, pCut1, k )
    {
        // get the next free cut
        assert( pCutSet->nCuts <= pCutSet->nCutsMax );
        pCut = pCutSet->ppCuts[pCutSet->nCuts];
        // make sure K-feasible cut exists
        if ( If_WordCountOnes(pCut0->uSign | pCut1->uSign) > p->pPars->nLutSize )
            continue;

        pCut0R = pCut0;
        pCut1R = pCut1;
        fFunc0R = pCut0->iCutFunc ^ pCut0->fCompl ^ pObj->fCompl0;
        fFunc1R = pCut1->iCutFunc ^ pCut1->fCompl ^ pObj->fCompl1;
        if ( !p->pPars->fUseTtPerm || pCut0->nLeaves > pCut1->nLeaves || (pCut0->nLeaves == pCut1->nLeaves && fFunc0R > fFunc1R) )
        {
        }
        else
        {
            ABC_SWAP( If_Cut_t *, pCut0R, pCut1R );
            ABC_SWAP( int, fFunc0R, fFunc1R );
        }        

        // merge the cuts
        if ( p->pPars->fUseTtPerm )
        {
            if ( !If_CutMerge( p, pCut0R, pCut1R, pCut ) )
                continue;
        }
        else
        {
            if ( !If_CutMergeOrdered( p, pCut0, pCut1, pCut ) )
                continue;
        }
        if ( pObj->fSpec && pCut->nLeaves == (unsigned)p->pPars->nLutSize )
            continue;
        p->nCutsMerged++;
        p->nCutsTotal++;
        // check if this cut is contained in any of the available cuts
        if ( !p->pPars->fSkipCutFilter && If_CutFilter( pCutSet, pCut, fSave0 ) )
            continue;
        // check if the cut is a special AND-gate cut
        pCut->fAndCut = fUseAndCut && pCut->nLeaves == 2 && pCut->pLeaves[0] == pObj->pFanin0->Id && pCut->pLeaves[1] == pObj->pFanin1->Id;
        //assert( pCut->nLeaves != 2 || pCut->pLeaves[0] < pCut->pLeaves[1] );
        //assert( pCut->nLeaves != 2 || pObj->pFanin0->Id < pObj->pFanin1->Id );
        // compute the truth table
        pCut->iCutFunc = -1;
        pCut->fCompl = 0;
        if ( p->pPars->fTruth )
        {
//            int nShared = pCut0->nLeaves + pCut1->nLeaves - pCut->nLeaves;
            abctime clk = 0;
            if ( p->pPars->fVerbose )
                clk = Abc_Clock();
            if ( p->pPars->fUseTtPerm )
                fChange = If_CutComputeTruthPerm( p, pCut, pCut0R, pCut1R, fFunc0R, fFunc1R );
            else
                fChange = If_CutComputeTruth( p, pCut, pCut0, pCut1, pObj->fCompl0, pObj->fCompl1 );
            if ( p->pPars->fVerbose )
                p->timeCache[4] += Abc_Clock() - clk;
            if ( !p->pPars->fSkipCutFilter && fChange && If_CutFilter( pCutSet, pCut, fSave0 ) )
                continue;
            if ( p->pPars->fUseDsd )
            {
                extern void If_ManCacheRecord( If_Man_t * p, int iDsd0, int iDsd1, int nShared, int iDsd );
                int truthId = Abc_Lit2Var(pCut->iCutFunc);
                if ( truthId >= Vec_IntSize(p->vTtDsds[pCut->nLeaves]) || Vec_IntEntry(p->vTtDsds[pCut->nLeaves], truthId) == -1 )
                {
                    while ( truthId >= Vec_IntSize(p->vTtDsds[pCut->nLeaves]) )
                    {
                        Vec_IntPush( p->vTtDsds[pCut->nLeaves], -1 );
                        for ( v = 0; v < Abc_MaxInt(6, pCut->nLeaves); v++ )
                            Vec_StrPush( p->vTtPerms[pCut->nLeaves], IF_BIG_CHAR );
                    }
                    iCutDsd = If_DsdManCompute( p->pIfDsdMan, If_CutTruthWR(p, pCut), pCut->nLeaves, (unsigned char *)If_CutDsdPerm(p, pCut), p->pPars->pLutStruct );
                    Vec_IntWriteEntry( p->vTtDsds[pCut->nLeaves], truthId, iCutDsd );
                }
                assert( If_DsdManSuppSize(p->pIfDsdMan, If_CutDsdLit(p, pCut)) == (int)pCut->nLeaves );
                //If_ManCacheRecord( p, If_CutDsdLit(p, pCut0), If_CutDsdLit(p, pCut1), nShared, If_CutDsdLit(p, pCut) );
            }
            // run user functions
            pCut->fUseless = 0;
            if ( p->pPars->pFuncCell )
            {
                assert( p->pPars->fUseTtPerm == 0 );
                assert( pCut->nLimit >= 4 && pCut->nLimit <= 16 );
                if ( p->pPars->fUseDsd )
                    pCut->fUseless = If_DsdManCheckDec( p->pIfDsdMan, If_CutDsdLit(p, pCut) );
                else
                    pCut->fUseless = !p->pPars->pFuncCell( p, If_CutTruth(p, pCut), Abc_MaxInt(6, pCut->nLeaves), pCut->nLeaves, p->pPars->pLutStruct );
                p->nCutsUselessAll += pCut->fUseless;
                p->nCutsUseless[pCut->nLeaves] += pCut->fUseless;
                p->nCutsCountAll++;
                p->nCutsCount[pCut->nLeaves]++;
                // skip 5-input cuts, which cannot be decomposed
                if ( (p->pPars->fEnableCheck75 || p->pPars->fEnableCheck75u) && pCut->nLeaves == 5 && pCut->nLimit == 5 )
                {
                    extern int If_CluCheckDecInAny( word t, int nVars );
                    extern int If_CluCheckDecOut( word t, int nVars );
                    unsigned TruthU = *If_CutTruth(p, pCut);
                    word Truth = (((word)TruthU << 32) | (word)TruthU);
                    p->nCuts5++;
                    if ( If_CluCheckDecInAny( Truth, 5 ) )
                        p->nCuts5a++;
                    else
                        continue;
                }
                else if ( p->pPars->fVerbose && pCut->nLeaves == 5 )
                {
                    extern int If_CluCheckDecInAny( word t, int nVars );
                    extern int If_CluCheckDecOut( word t, int nVars );
                    unsigned TruthU = *If_CutTruth(p, pCut);
                    word Truth = (((word)TruthU << 32) | (word)TruthU);
                    p->nCuts5++;
                    if ( If_CluCheckDecInAny( Truth, 5 ) || If_CluCheckDecOut( Truth, 5 ) )
                        p->nCuts5a++;
                }
            }
            else if ( p->pPars->fUseDsdTune )
            {
                pCut->fUseless = If_DsdManReadMark( p->pIfDsdMan, If_CutDsdLit(p, pCut) );
                p->nCutsUselessAll += pCut->fUseless;
                p->nCutsUseless[pCut->nLeaves] += pCut->fUseless;
                p->nCutsCountAll++;
                p->nCutsCount[pCut->nLeaves]++;
            }
            else if ( p->pPars->fUse34Spec )
            {
                assert( pCut->nLeaves <= 4 );
                if ( pCut->nLeaves == 4 && !Abc_Tt4Check( (int)(0xFFFF & *If_CutTruth(p, pCut)) ) )
                    pCut->fUseless = 1;
            }
            else 
            {
                if ( p->pPars->fUseAndVars )
                {
                    int iDecMask = -1, truthId = Abc_Lit2Var(pCut->iCutFunc);
                    assert( p->pPars->nLutSize <= 13 );
                    if ( truthId >= Vec_IntSize(p->vTtDecs[pCut->nLeaves]) || Vec_IntEntry(p->vTtDecs[pCut->nLeaves], truthId) == -1 )
                    {
                        while ( truthId >= Vec_IntSize(p->vTtDecs[pCut->nLeaves]) )
                            Vec_IntPush( p->vTtDecs[pCut->nLeaves], -1 );
                        if ( (int)pCut->nLeaves > p->pPars->nLutSize / 2 && (int)pCut->nLeaves <= 2 * (p->pPars->nLutSize / 2) )
                            iDecMask = Abc_TtProcessBiDec( If_CutTruthWR(p, pCut), (int)pCut->nLeaves, p->pPars->nLutSize / 2 );
                        else
                            iDecMask = 0;
                        Vec_IntWriteEntry( p->vTtDecs[pCut->nLeaves], truthId, iDecMask );
                    }
                    iDecMask = Vec_IntEntry(p->vTtDecs[pCut->nLeaves], truthId);
                    assert( iDecMask >= 0 );
                    pCut->fUseless = (int)(iDecMask == 0 && (int)pCut->nLeaves > p->pPars->nLutSize / 2);
                    p->nCutsUselessAll += pCut->fUseless;
                    p->nCutsUseless[pCut->nLeaves] += pCut->fUseless;
                    p->nCutsCountAll++;
                    p->nCutsCount[pCut->nLeaves]++;
                }
                if ( p->pPars->fUseCofVars && (!p->pPars->fUseAndVars || pCut->fUseless) )
                {
                    int iCofVar = -1, truthId = Abc_Lit2Var(pCut->iCutFunc);
                    if ( truthId >= Vec_StrSize(p->vTtVars[pCut->nLeaves]) || Vec_StrEntry(p->vTtVars[pCut->nLeaves], truthId) == (char)-1 )
                    {
                        while ( truthId >= Vec_StrSize(p->vTtVars[pCut->nLeaves]) )
                            Vec_StrPush( p->vTtVars[pCut->nLeaves], (char)-1 );
                        iCofVar = Abc_TtCheckCondDep( If_CutTruthWR(p, pCut), pCut->nLeaves, p->pPars->nLutSize / 2 );
                        Vec_StrWriteEntry( p->vTtVars[pCut->nLeaves], truthId, (char)iCofVar );
                    }
                    iCofVar = Vec_StrEntry(p->vTtVars[pCut->nLeaves], truthId);
                    assert( iCofVar >= 0 && iCofVar <= (int)pCut->nLeaves );
                    pCut->fUseless = (int)(iCofVar == (int)pCut->nLeaves && pCut->nLeaves > 0);
                    p->nCutsUselessAll += pCut->fUseless;
                    p->nCutsUseless[pCut->nLeaves] += pCut->fUseless;
                    p->nCutsCountAll++;
                    p->nCutsCount[pCut->nLeaves]++;
                }
            }
        }
        
        // compute the application-specific cost and depth
        pCut->fUser = (p->pPars->pFuncCost != NULL);
        pCut->Cost = p->pPars->pFuncCost? p->pPars->pFuncCost(p, pCut) : 0;
        if ( pCut->Cost == IF_COST_MAX )
            continue;
        // check if the cut satisfies the required times
        if ( p->pPars->fDelayOpt )
        {
            pCut->Delay = If_CutSopBalanceEval( p, pCut, NULL );
//            if ( pCut->Delay >= pObj->Level && pCut->nLeaves > 2 )
//                pCut->Delay += 1;
        }
        else if ( p->pPars->fDsdBalance )
        {
            pCut->Delay = If_CutDsdBalanceEval( p, pCut, NULL );
//            if ( pCut->Delay >= pObj->Level && pCut->nLeaves > 2 )
//                pCut->Delay += 1;
        }
        else if ( p->pPars->fUserRecLib )
        {
            pCut->Delay = If_CutDelayRecCost3( p, pCut, pObj ); 
//            if ( pCut->Delay >= pObj->Level && pCut->nLeaves > 2 )
//                pCut->Delay += 1;
        }
        else if ( p->pPars->fDelayOptLut )
            pCut->Delay = If_CutLutBalanceEval( p, pCut );
        else if( p->pPars->nGateSize > 0 )
            pCut->Delay = If_CutDelaySop( p, pCut );
        else 
            pCut->Delay = If_CutDelay( p, pObj, pCut );
        if ( pCut->Delay == -1 )
            continue;
        if ( Mode && pCut->Delay > pObj->Required + p->fEpsilon )
            continue;
        // compute area of the cut (this area may depend on the application specific cost)
        pCut->Area = (Mode == 2)? If_CutAreaDerefed( p, pCut ) : If_CutAreaFlow( p, pCut );
        if ( p->pPars->fEdge )
            pCut->Edge = (Mode == 2)? If_CutEdgeDerefed( p, pCut ) : If_CutEdgeFlow( p, pCut );
        if ( p->pPars->fPower )
            pCut->Power = (Mode == 2)? If_CutPowerDerefed( p, pCut, pObj ) : If_CutPowerFlow( p, pCut, pObj );
//        pCut->AveRefs = (Mode == 0)? (float)0.0 : If_CutAverageRefs( p, pCut );
        // insert the cut into storage
        If_CutSort( p, pCutSet, pCut );
//        If_CutTraverse( p, pObj, pCut );
    } 
    assert( pCutSet->nCuts > 0 );
//    If_CutVerifyCuts( pCutSet, !p->pPars->fUseTtPerm );

    // update the best cut
    if ( !fPreprocess || pCutSet->ppCuts[0]->Delay <= pObj->Required + p->fEpsilon )
    {
        If_CutCopy( p, If_ObjCutBest(pObj), pCutSet->ppCuts[0] );
        if(p->pPars->fUserRecLib)
            assert(If_ObjCutBest(pObj)->Cost < IF_COST_MAX && If_ObjCutBest(pObj)->Delay < ABC_INFINITY);
    }
    // add the trivial cut to the set
    if ( !pObj->fSkipCut && If_ObjCutBest(pObj)->nLeaves > 1 )
    {
        If_ManSetupCutTriv( p, pCutSet->ppCuts[pCutSet->nCuts++], pObj->Id );
        assert( pCutSet->nCuts <= pCutSet->nCutsMax+1 );
    }
//    if ( If_ObjCutBest(pObj)->nLeaves == 0 )
//        p->nBestCutSmall[0]++;
//    else if ( If_ObjCutBest(pObj)->nLeaves == 1 )
//        p->nBestCutSmall[1]++;

    // ref the selected cut
    if ( Mode && pObj->nRefs > 0 )
        If_CutAreaRef( p, If_ObjCutBest(pObj) );
    if ( If_ObjCutBest(pObj)->fUseless )
        Abc_Print( 1, "The best cut is useless.\n" );
    // call the user specified function for each cut
    if ( p->pPars->pFuncUser )
        If_ObjForEachCut( pObj, pCut, i )
            p->pPars->pFuncUser( p, pObj, pCut );
    // free the cuts
    If_ManDerefNodeCutSet( p, pObj );
}